

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder.h
# Opt level: O0

int decoder_get_raw_buffer_value(ndn_decoder_t *decoder,uint8_t *value,uint32_t size)

{
  int rest_length;
  uint32_t size_local;
  uint8_t *value_local;
  ndn_decoder_t *decoder_local;
  
  if ((int)(decoder->input_size - decoder->offset) < (int)size) {
    decoder_local._4_4_ = -10;
  }
  else {
    memcpy(value,decoder->input_value + decoder->offset,(ulong)size);
    decoder->offset = size + decoder->offset;
    decoder_local._4_4_ = 0;
  }
  return decoder_local._4_4_;
}

Assistant:

static inline int
decoder_get_raw_buffer_value(ndn_decoder_t* decoder, uint8_t* value, uint32_t size)
{
  int rest_length = decoder->input_size - decoder->offset;
  if (rest_length < (int) size) {
    return NDN_OVERSIZE;
  }
  memcpy(value, decoder->input_value + decoder->offset, size);
  decoder->offset += size;
  return 0;
}